

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

int node::
    index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              (TreeIndexAll *ti,Node<label::StringLabel> *n,LabelDictionary<label::StringLabel> *ld,
              UnitCostModelLD<label::StringLabel> *cm,int *start_preorder,int *start_postorder,
              int start_depth,int *subtree_max_depth,int start_height,int *height,
              int parent_preorder,bool is_rightmost_child)

{
  pointer *this;
  uint parent_preorder_00;
  value_type vVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  Node<label::StringLabel> *pNVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ConstReference pSVar11;
  size_type sVar12;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_> *pvVar13;
  reference n_00;
  reference pvVar14;
  iterator __first;
  reference piVar15;
  reference pvVar16;
  uint *puVar17;
  mapped_type *this_00;
  int *piVar18;
  reference pvVar19;
  reference pvVar20;
  reference local_1d0;
  reference local_1c0;
  reference local_1b0;
  int *child_id;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_188;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_180;
  iterator it;
  undefined1 local_170 [4];
  int current_child;
  vector<int,_std::allocator<int>_> children_subtree_deletion_costs;
  int local_144;
  __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
  local_140;
  int local_134;
  Node<label::StringLabel> *local_130;
  __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
  local_128;
  __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
  local_120;
  const_iterator children_end_it;
  const_iterator children_start_it;
  int local_108;
  int num_children;
  int previous_child_po;
  int left_fav_child;
  int favorable_child;
  int largest_subtree_size_child;
  int subtree_size_child;
  int first_child_postorder;
  value_type vStack_e8;
  bool is_current_child_rightmost;
  int this_height;
  int this_subtree_max_depth;
  vector<int,_std::allocator<int>_> local_d8;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> children_sorted_subtree_size;
  vector<int,_std::allocator<int>_> children_preorders;
  vector<int,_std::allocator<int>_> children_postorders;
  int this_nodes_preorder;
  int postorder_r;
  int preorder_r;
  int type;
  int label_id;
  int desc_sum;
  bool is_rightmost_child_local;
  int *start_postorder_local;
  int *start_preorder_local;
  UnitCostModelLD<label::StringLabel> *cm_local;
  LabelDictionary<label::StringLabel> *ld_local;
  Node<label::StringLabel> *n_local;
  TreeIndexAll *ti_local;
  
  label_id._3_1_ = is_rightmost_child;
  type = 0;
  _desc_sum = (uint *)start_postorder;
  start_postorder_local = start_preorder;
  start_preorder_local = (int *)cm;
  cm_local = (UnitCostModelLD<label::StringLabel> *)ld;
  ld_local = (LabelDictionary<label::StringLabel> *)n;
  n_local = (Node<label::StringLabel> *)ti;
  pSVar11 = Node<label::StringLabel>::label(n);
  preorder_r = label::LabelDictionary<label::StringLabel>::insert(ld,pSVar11);
  pSVar11 = Node<label::StringLabel>::label((Node<label::StringLabel> *)ld_local);
  uVar7 = label::StringLabel::get_type(pSVar11);
  parent_preorder_00 = *start_postorder_local;
  *start_postorder_local = *start_postorder_local + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_b8);
  sVar12 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&n_local[0xf].label_);
  if ((int)sVar12 < start_depth + 1) {
    pNVar5 = n_local + 0xf;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::vector(&local_d8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&pNVar5->label_,&local_d8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
  }
  vStack_e8 = 0;
  first_child_postorder = 0;
  subtree_size_child._3_1_ = 0;
  largest_subtree_size_child = -1;
  favorable_child = -1;
  left_fav_child = -1;
  previous_child_po = -1;
  num_children = -1;
  local_108 = -1;
  children_start_it._M_current._4_4_ = 0;
  pvVar13 = Node<label::StringLabel>::get_children((Node<label::StringLabel> *)ld_local);
  children_end_it =
       std::
       begin<std::vector<node::Node<label::StringLabel>,std::allocator<node::Node<label::StringLabel>>>>
                 (pvVar13);
  pvVar13 = Node<label::StringLabel>::get_children((Node<label::StringLabel> *)ld_local);
  local_120._M_current =
       (Node<label::StringLabel> *)
       std::
       end<std::vector<node::Node<label::StringLabel>,std::allocator<node::Node<label::StringLabel>>>>
                 (pvVar13);
  while (bVar6 = __gnu_cxx::operator!=(&children_end_it,&local_120), bVar6) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,start_postorder_local);
    local_130 = children_end_it._M_current;
    local_128 = std::
                next<__gnu_cxx::__normal_iterator<node::Node<label::StringLabel>const*,std::vector<node::Node<label::StringLabel>,std::allocator<node::Node<label::StringLabel>>>>>
                          (children_end_it._M_current,1);
    bVar6 = __gnu_cxx::operator==(&local_128,&local_120);
    if (bVar6) {
      subtree_size_child._3_1_ = 1;
    }
    puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&n_local[8].label_,
                                 (long)*start_postorder_local);
    pNVar5 = n_local;
    *puVar17 = parent_preorder_00;
    n_00 = __gnu_cxx::
           __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
           ::operator*(&children_end_it);
    favorable_child =
         index_tree_recursion<node::TreeIndexAll,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
                   ((TreeIndexAll *)pNVar5,n_00,(LabelDictionary<label::StringLabel> *)cm_local,
                    (UnitCostModelLD<label::StringLabel> *)start_preorder_local,
                    start_postorder_local,(int *)_desc_sum,start_depth + 1,&stack0xffffffffffffff18,
                    start_height,height,parent_preorder_00,(bool)(subtree_size_child._3_1_ & 1));
    type = type + favorable_child;
    local_134 = *_desc_sum - 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_134);
    if (left_fav_child < favorable_child) {
      left_fav_child = favorable_child;
      num_children = local_108;
      previous_child_po = *_desc_sum - 1;
    }
    if (first_child_postorder < *height) {
      first_child_postorder = *height;
    }
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(n_local + 0x13),
                         (long)(int)(*_desc_sum - 1));
    *pvVar14 = local_108;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_b8,&favorable_child);
    pvVar13 = Node<label::StringLabel>::get_children((Node<label::StringLabel> *)ld_local);
    local_140._M_current =
         (Node<label::StringLabel> *)
         std::
         vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
         begin(pvVar13);
    bVar6 = __gnu_cxx::operator==(&children_end_it,&local_140);
    if (bVar6) {
      largest_subtree_size_child = *_desc_sum - 1;
    }
    else {
      local_144 = *_desc_sum - 1;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)(n_local + 0xf),&local_144);
    }
    children_start_it._M_current._4_4_ = children_start_it._M_current._4_4_ + 1;
    local_108 = *_desc_sum - 1;
    __gnu_cxx::
    __normal_iterator<const_node::Node<label::StringLabel>_*,_std::vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>_>
    ::operator++(&children_end_it);
  }
  iVar8 = ~*_desc_sum +
          *(int *)&(n_local->children_).
                   super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  iVar9 = ~parent_preorder_00 +
          *(int *)&(n_local->children_).
                   super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&n_local[0x10].label_.label_.field_2 + 8),(long)(int)*_desc_sum);
  *pvVar14 = previous_child_po;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[0x11].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)*_desc_sum);
  *pvVar14 = num_children;
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_b8);
  children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_b8);
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             children_subtree_deletion_costs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_170);
  it._M_current._4_4_ = 0;
  local_180._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_b8);
  while( true ) {
    local_188._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_b8);
    bVar6 = __gnu_cxx::operator!=(&local_180,&local_188);
    if (!bVar6) break;
    sVar12 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_170);
    it._M_current._4_4_ = (int)sVar12;
    if (it._M_current._4_4_ == 0) {
      piVar15 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_180);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_170,piVar15);
    }
    else {
      pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_170,
                           (long)(it._M_current._4_4_ + -1));
      iVar10 = *pvVar14;
      piVar15 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_180);
      __range3._4_4_ = iVar10 + *piVar15;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_170,
                 (value_type_conflict *)((long)&__range3 + 4));
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_180);
  }
  pvVar16 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&n_local[0x12].children_.
                             super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)(int)*_desc_sum);
  std::vector<int,_std::allocator<int>_>::operator=
            (pvVar16,(vector<int,_std::allocator<int>_> *)local_170);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  *height = first_child_postorder + 1;
  vVar1 = *height;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&n_local[0x11].label_.label_.field_2,
                       (long)(int)*_desc_sum);
  *pvVar14 = vVar1;
  iVar10 = type + 1;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(n_local + 2),(long)(int)*_desc_sum);
  *pvVar14 = iVar10;
  iVar10 = type + 1;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&n_local[2].label_,
                       (long)(int)parent_preorder_00);
  *pvVar14 = iVar10;
  this = &children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  __end3 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  child_id = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)this);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&child_id), bVar6) {
    local_1b0 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&__end3);
    uVar2 = *_desc_sum;
    puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)(n_local + 8),(long)*local_1b0
                                );
    *puVar17 = uVar2;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end3);
  }
  puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               ((long)&n_local[2].label_.label_.field_2 + 8),(long)(int)*_desc_sum);
  *puVar17 = parent_preorder_00;
  uVar2 = *_desc_sum;
  puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &n_local[3].children_.
                                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)(int)parent_preorder_00);
  *puVar17 = uVar2;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&n_local[3].label_.label_.field_2,
                       (long)(int)parent_preorder_00);
  *pvVar14 = iVar8;
  puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &n_local[4].children_.
                                super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,(long)iVar8);
  *puVar17 = parent_preorder_00;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[4].label_.label_._M_string_length,(long)(int)parent_preorder_00);
  *pvVar14 = iVar9;
  puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(n_local + 5),(long)iVar9);
  *puVar17 = parent_preorder_00;
  pvVar16 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&n_local[5].label_,(long)(int)*_desc_sum);
  std::vector<int,_std::allocator<int>_>::operator=
            (pvVar16,(vector<int,_std::allocator<int>_> *)
                     &children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  pvVar16 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)((long)&n_local[5].label_.label_.field_2 + 8),
                         (long)(int)parent_preorder_00);
  std::vector<int,_std::allocator<int>_>::operator=
            (pvVar16,(vector<int,_std::allocator<int>_> *)
                     &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar8 = preorder_r;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &(n_local->children_).
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (long)(int)parent_preorder_00);
  iVar10 = preorder_r;
  *pvVar14 = iVar8;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[1].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(long)(int)*_desc_sum);
  *pvVar14 = iVar10;
  puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &(n_local->label_).label_.field_2,(long)(int)*_desc_sum);
  *puVar17 = uVar7;
  this_00 = std::
            unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[]((unordered_map<int,_std::vector<int,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          *)((long)&n_local[0xf].label_.label_.field_2 + 8),&preorder_r);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict *)_desc_sum);
  iVar8 = preorder_r;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[1].label_.label_._M_string_length,(long)iVar9);
  *pvVar14 = iVar8;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       ((long)&n_local[8].label_.label_.field_2 + 8),(long)(int)*_desc_sum);
  *pvVar14 = start_depth;
  pvVar16 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::at((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)&n_local[0xf].label_,(long)start_depth);
  std::vector<int,_std::allocator<int>_>::push_back(pvVar16,(value_type_conflict *)_desc_sum);
  bVar6 = Node<label::StringLabel>::is_leaf((Node<label::StringLabel> *)ld_local);
  if (bVar6) {
    vStack_e8 = start_depth;
  }
  vVar1 = vStack_e8;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&n_local[9].label_.label_.field_2,
                       (long)(int)*_desc_sum);
  *pvVar14 = vVar1;
  piVar18 = std::max<int>(subtree_max_depth,&stack0xffffffffffffff18);
  *subtree_max_depth = *piVar18;
  bVar6 = Node<label::StringLabel>::is_leaf((Node<label::StringLabel> *)ld_local);
  if (bVar6) {
    first_child_postorder = start_height;
  }
  iVar8 = first_child_postorder;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&n_local[0x11].label_.label_.field_2,
                       (long)(int)*_desc_sum);
  *pvVar14 = iVar8;
  piVar18 = std::max<int>(height,&first_child_postorder);
  iVar8 = largest_subtree_size_child;
  *height = *piVar18;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[9].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)*_desc_sum);
  *pvVar14 = iVar8;
  bVar6 = Node<label::StringLabel>::is_leaf((Node<label::StringLabel> *)ld_local);
  if (bVar6) {
    uVar7 = *_desc_sum;
    puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &n_local[6].children_.
                                  super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)(int)*_desc_sum);
    *puVar17 = uVar7;
  }
  else {
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &n_local[6].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)largest_subtree_size_child);
    vVar1 = *pvVar14;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &n_local[6].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)*_desc_sum);
    *pvVar14 = vVar1;
  }
  bVar6 = Node<label::StringLabel>::is_leaf((Node<label::StringLabel> *)ld_local);
  if (bVar6) {
    puVar17 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)
                                 &n_local[6].label_.label_.field_2,(long)(int)parent_preorder_00);
    *puVar17 = parent_preorder_00;
  }
  else {
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&n_local[6].label_.label_.field_2,
                         (long)(int)(parent_preorder_00 + 1));
    vVar1 = *pvVar14;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&n_local[6].label_.label_.field_2,
                         (long)(int)parent_preorder_00);
    *pvVar14 = vVar1;
  }
  iVar8 = parent_preorder_00 + type;
  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)
                       &n_local[7].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(long)(int)parent_preorder_00);
  *pvVar14 = iVar8;
  if (0 < children_start_it._M_current._4_4_) {
    pNVar5 = n_local + 0xb;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_1c0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)&pNVar5->label_,(long)*pvVar14);
    std::_Bit_reference::operator=(&local_1c0,true);
  }
  if (0 < children_start_it._M_current._4_4_) {
    pNVar5 = n_local + 0xc;
    pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)(children_start_it._M_current._4_4_ + -1));
    local_1d0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           &(pNVar5->children_).
                            super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(long)*pvVar14);
    std::_Bit_reference::operator=(&local_1d0,true);
  }
  iVar8 = type + 1;
  pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                      ((vector<long_long,_std::allocator<long_long>_> *)
                       ((long)&n_local[0xc].label_.label_.field_2 + 8),(long)(int)parent_preorder_00
                      );
  *pvVar19 = (long)iVar8 + *pvVar19;
  if (parent_preorder != -1) {
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         ((long)&n_local[0xc].label_.label_.field_2 + 8),
                         (long)(int)parent_preorder_00);
    lVar3 = *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         ((long)&n_local[0xc].label_.label_.field_2 + 8),(long)parent_preorder);
    *pvVar19 = lVar3 + *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         &n_local[0xd].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)(int)parent_preorder_00);
    lVar3 = *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         &n_local[0xd].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)parent_preorder);
    *pvVar19 = lVar3 + *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         &n_local[0xd].label_.label_.field_2,(long)(int)parent_preorder_00);
    lVar3 = *pvVar19;
    pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         &n_local[0xd].label_.label_.field_2,(long)parent_preorder);
    *pvVar19 = lVar3 + *pvVar19;
    if (parent_preorder_00 != parent_preorder + 1U) {
      iVar8 = type + 1;
      pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                          ((vector<long_long,_std::allocator<long_long>_> *)
                           &n_local[0xd].children_.
                            super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)parent_preorder
                          );
      *pvVar19 = (long)iVar8 + *pvVar19;
    }
    if ((label_id._3_1_ & 1) == 0) {
      iVar8 = type + 1;
      pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                          ((vector<long_long,_std::allocator<long_long>_> *)
                           &n_local[0xd].label_.label_.field_2,(long)parent_preorder);
      *pvVar19 = (long)iVar8 + *pvVar19;
    }
  }
  iVar8 = type + 1;
  iVar9 = type + 4;
  pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                      ((vector<long_long,_std::allocator<long_long>_> *)
                       ((long)&n_local[0xc].label_.label_.field_2 + 8),(long)(int)parent_preorder_00
                      );
  lVar3 = *pvVar19;
  pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                      ((vector<long_long,_std::allocator<long_long>_> *)
                       ((long)&n_local[0xc].label_.label_.field_2 + 8),(long)(int)parent_preorder_00
                      );
  *pvVar19 = (iVar8 * iVar9) / 2 - lVar3;
  iVar8 = type + 1;
  pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                      ((vector<long_long,_std::allocator<long_long>_> *)
                       &n_local[0xd].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (long)(int)parent_preorder_00);
  *pvVar19 = (long)iVar8 + *pvVar19;
  iVar8 = type + 1;
  pvVar19 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                      ((vector<long_long,_std::allocator<long_long>_> *)
                       &n_local[0xd].label_.label_.field_2,(long)(int)parent_preorder_00);
  *pvVar19 = (long)iVar8 + *pvVar19;
  dVar4 = cost_model::UnitCostModelLD<label::StringLabel>::del
                    ((UnitCostModelLD<label::StringLabel> *)start_preorder_local,preorder_r);
  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)
                       &n_local[0xe].children_.
                        super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,(long)(int)parent_preorder_00);
  *pvVar20 = dVar4 + *pvVar20;
  dVar4 = cost_model::UnitCostModelLD<label::StringLabel>::ins
                    ((UnitCostModelLD<label::StringLabel> *)start_preorder_local,preorder_r);
  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                      ((vector<double,_std::allocator<double>_> *)
                       &n_local[0xe].label_.label_._M_string_length,(long)(int)parent_preorder_00);
  *pvVar20 = dVar4 + *pvVar20;
  if (parent_preorder != -1) {
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[0xe].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(long)(int)parent_preorder_00);
    dVar4 = *pvVar20;
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[0xe].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,(long)parent_preorder);
    *pvVar20 = dVar4 + *pvVar20;
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[0xe].label_.label_._M_string_length,(long)(int)parent_preorder_00)
    ;
    dVar4 = *pvVar20;
    pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[0xe].label_.label_._M_string_length,(long)parent_preorder);
    *pvVar20 = dVar4 + *pvVar20;
  }
  *_desc_sum = *_desc_sum + 1;
  iVar8 = type + 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &children_sorted_subtree_size.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &children_preorders.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return iVar8;
}

Assistant:

int index_tree_recursion(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm,
    int& start_preorder, int& start_postorder,
    int start_depth, int& subtree_max_depth,
    int start_height, int& height,
    int parent_preorder, bool is_rightmost_child) {
  
  // Stores number of descendants of this node. Incrementally computed while
  // traversing the children.
  int desc_sum = 0;

  // Stores the current node's label id.
  int label_id = ld.insert(n.label());

  // Stores the current node's type.
  int type = n.label().get_type();

  // Here, start_preorder holds this node's preorder id.
  
  int preorder_r = 0;
  int postorder_r = 0;

  // This node's preorder id.
  int this_nodes_preorder = start_preorder;

  // Increment start_preorder to hold the correct id of the consecutive node
  // in preorder.
  ++start_preorder;
  
  // To store postorder ids of this node's children.
  std::vector<int> children_postorders;
  // To store preorder ids of this node's children.
  std::vector<int> children_preorders;
  // Store the height of all children.
  std::vector<int> children_sorted_subtree_size;

  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    // Add a vector for depth=start_depth in depth inverted list.
    // NOTE: `inverted_list_depth_to_postl_.size()`` returns an `unsigned int`.
    //       If `inverted_list_depth_to_postl_.size = 0`, then
    //       substracting 1 causes incorrect validation of the condition.
    if (static_cast<int>(ti.inverted_list_depth_to_postl_.size()) < (start_depth + 1)) {
      ti.inverted_list_depth_to_postl_.push_back(std::vector<int>());
    }
  }
  
  // This node's subtree max depth.
  int this_subtree_max_depth = 0;
  // This node's height.
  int this_height = 0;

  // To store if the current child in the loop is rightmost.
  bool is_current_child_rightmost = false;

  // Treat the first child separately (non-key-root, updates parent's lld).
  int first_child_postorder = -1;
  // Number of nodes of children subtrees.
  int subtree_size_child = -1;
  // Number of nodes of the child with the largest subtree.
  int largest_subtree_size_child = -1;
  // Postorder number of the favorable child.
  int favorable_child = -1;
  // Postorder number of the left sibling of the favorable child.
  int left_fav_child = -1;
  // Postorder number of the previous child.
  int previous_child_po = -1;
  // Count number of children.
  int num_children = 0;
  // Recursions to childen nodes.
  auto children_start_it = std::begin(n.get_children());
  auto children_end_it = std::end(n.get_children());

  while (children_start_it != children_end_it) {
    // Add the preoder of the current child to children_preorders.
    children_preorders.push_back(start_preorder);

    // Check if this child is rightmost.
    if(std::next(children_start_it) == children_end_it) {
      is_current_child_rightmost = true;
    }

    // PreLToParent index
    if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
      ti.prel_to_parent_[start_preorder] = this_nodes_preorder;
    }
    
    subtree_size_child = index_tree_recursion(ti, *children_start_it, ld, cm,
        start_preorder, start_postorder, start_depth + 1,
        this_subtree_max_depth, start_height, height,
        this_nodes_preorder, is_current_child_rightmost);
    desc_sum += subtree_size_child;
    
    // Add the postorder of the current child to children_postorders.
    children_postorders.push_back(start_postorder-1);
    
    // PostLToFavChild index
    if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
      if (subtree_size_child > largest_subtree_size_child) {
        largest_subtree_size_child = subtree_size_child;
        left_fav_child = previous_child_po;
        favorable_child = start_postorder-1;
      }
    }

    // PostLToHeight index
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      if (height > this_height) {
        this_height = height;
      }
    }

    // PostLToLeftSibling index
    if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
      ti.postl_to_left_sibling_[start_postorder-1] = previous_child_po;
    }
    
    if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
      children_sorted_subtree_size.push_back(subtree_size_child);
    }

    // Treat the first child separately.
    if (children_start_it == n.get_children().begin()) {
      // Here, start_postorder-1 is the postorder of the current child.
      // Set this node's lld to its first child's lld.
      first_child_postorder = start_postorder-1;
    } else {
      if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
        // Add current child to kr.
        ti.list_kr_.push_back(start_postorder-1);
      }
    }
    
    ++num_children;

    previous_child_po = start_postorder-1;
    
    // Continue to consecutive children.
    ++children_start_it;
  }

  // Here, start_postorder holds this node's postorder id.
  
  // Calculate right-to-left preorder.
  preorder_r = ti.tree_size_ - 1 - start_postorder;
  
  // Calculate right-to-left postorder.
  postorder_r = ti.tree_size_ - 1 - this_nodes_preorder;
  
  // PostLToFavChild index
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_[start_postorder] = favorable_child;
    ti.postl_to_left_fav_child_[start_postorder] = left_fav_child;
  }

  // PostLToOrderedChildSize
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    // Sort all children by subtree size.
    std::sort (children_sorted_subtree_size.begin(), children_sorted_subtree_size.end());

    // Removing subtree costs sorted ascending.
    std::vector<int> children_subtree_deletion_costs;
    // Iterate over all children and sum up the costs.
    int current_child = 0;
    for (std::vector<int>::iterator it=children_sorted_subtree_size.begin(); it!=children_sorted_subtree_size.end(); ++it) {
      current_child = children_subtree_deletion_costs.size();
      if (current_child == 0) {
        children_subtree_deletion_costs.push_back(*it);
      } else {
        children_subtree_deletion_costs.push_back(children_subtree_deletion_costs[current_child-1] + *it);
      }
    }
    ti.postl_to_ordered_child_size_[start_postorder] = children_subtree_deletion_costs;
  }

  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    height = this_height + 1;
    ti.postl_to_height_[start_postorder] = height;
  }

  // PostLToSize index
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_[start_postorder] = desc_sum + 1;
  }
  
  // PreLToSize index
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_[this_nodes_preorder] = desc_sum + 1;
  }
  
  // PostLToParent index
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    for (const auto& child_id : children_postorders) {
      ti.postl_to_parent_[child_id] = start_postorder;
    }
  }
  
  // PostLToPreL index
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_[start_postorder] = this_nodes_preorder;
  }
  
  // PreLToPostL index
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_[this_nodes_preorder] = start_postorder;
  }
  
  // PreLToPreR index
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_[this_nodes_preorder] = preorder_r;
  }
  
  // PreRToPreL index
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_[preorder_r] = this_nodes_preorder;
  }
  
  // PreLToPostR index
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_[this_nodes_preorder] = postorder_r;
  }
  
  // PostRToPreL index
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_[postorder_r] = this_nodes_preorder;
  }
  
  // PostLToChildren index
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_[start_postorder] = children_postorders;
  }
  
  // PreLToChildren index
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_[this_nodes_preorder] = children_preorders;
  }
  
  // PreLToLabelId index
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_[this_nodes_preorder] = label_id;
  }
  
  // PostLToLabelId index
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_[start_postorder] = label_id;
  }
  
  // PostLToType index
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_[start_postorder] = type;
  }
  
  // InvertedListLabelIdToPostL index
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_[label_id].push_back(start_postorder);
  }
  
  // PostRToLabelId index
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_[postorder_r] = label_id;
  }
  
  // PostLToDepth index
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_[start_postorder] = start_depth;
  }
  
  // InvertedListDepthToPostL index
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.at(start_depth).push_back(start_postorder);
  }

  // PostLToSubtreeMaxDepth index
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_subtree_max_depth = start_depth;
    }
    ti.postl_to_subtree_max_depth_[start_postorder] = this_subtree_max_depth;
    // Update parent subtree's max depth.
    subtree_max_depth = std::max(subtree_max_depth, this_subtree_max_depth);
  }
  
  // PostLToHeight index
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    if (n.is_leaf()) {
      // If this node has no children, set the max depth to this node's depth.
      this_height = start_height;
    }
    ti.postl_to_height_[start_postorder] = this_height;
    // Update parent subtree's max depth.
    height = std::max(height, this_height);
  }
  
  // PostLToLCh index
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_[start_postorder] = first_child_postorder;
  }
  
  // PostLToLLD index
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's postorer.
      ti.postl_to_lld_[start_postorder] = start_postorder;
    } else {
      // This node's lld must be pushed after its childrens llds.
      // lld is indexed starting with 0, thus first_child_postorder-1.
      ti.postl_to_lld_[start_postorder] = ti.postl_to_lld_[first_child_postorder];
    }
  }

  // PreLToLLD index
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    if (n.is_leaf()) {
      // Set lld of this node to this node's preorder.
      ti.prel_to_lld_[this_nodes_preorder] = this_nodes_preorder;
    } else {
      // Push this node's lld to its first child (this_nodes_preorder + 1).
      ti.prel_to_lld_[this_nodes_preorder] = ti.prel_to_lld_[this_nodes_preorder + 1];
    }
  }

  // PreLToRLD index
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    // RLD of a node n is: pre(n)+size(n)-1; size(n)=desc_sum+1
    ti.prel_to_rld_[this_nodes_preorder] = this_nodes_preorder + desc_sum;
  }

  // PreLToTypeLeft index
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_left_[children_preorders[0]] = true;
    }
  }

  // PreLToTypeRight index
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    if (num_children > 0) {
      ti.prel_to_type_right_[children_preorders[num_children-1]] = true;
    }
  }

  // PreLToSpfCost indexes
  // TODO: Indexes store long long int, but desc_sum is an
  //       int. Verify if there is no weird conversion.
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_all_[this_nodes_preorder] += desc_sum + 1;
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the parent with this node's sum.
      ti.prel_to_cost_all_[parent_preorder] += ti.prel_to_cost_all_[this_nodes_preorder];
      ti.prel_to_cost_left_[parent_preorder] += ti.prel_to_cost_left_[this_nodes_preorder];
      ti.prel_to_cost_right_[parent_preorder] += ti.prel_to_cost_right_[this_nodes_preorder];
      // Check if this node is leftmost child of its parent.
      if (this_nodes_preorder != parent_preorder + 1) {
        ti.prel_to_cost_left_[parent_preorder] += desc_sum + 1;
      }
      // Check if this node is rightmost child of its parent.
      if (!is_rightmost_child) {
        ti.prel_to_cost_right_[parent_preorder] += desc_sum + 1;
      }
    }
    // Calculate the cost and store.
    ti.prel_to_cost_all_[this_nodes_preorder] =
        (desc_sum + 1) * (desc_sum + 1 + 3) / 2 - ti.prel_to_cost_all_[this_nodes_preorder];
    // Add this node's subtree size to this node's sum.
    ti.prel_to_cost_left_[this_nodes_preorder] += desc_sum + 1;
    ti.prel_to_cost_right_[this_nodes_preorder] += desc_sum + 1;
  }

  // PreLToSubtreeCost indexes
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    // Add the cost of this node's subtree.
    ti.prel_to_subtree_del_cost_[this_nodes_preorder] += cm.del(label_id);
    ti.prel_to_subtree_ins_cost_[this_nodes_preorder] += cm.ins(label_id);
    // If this node has a parent.
    if (parent_preorder != -1) {
      // Update the cost of the parent node subtree.
      ti.prel_to_subtree_del_cost_[parent_preorder] += ti.prel_to_subtree_del_cost_[this_nodes_preorder];
      ti.prel_to_subtree_ins_cost_[parent_preorder] += ti.prel_to_subtree_ins_cost_[this_nodes_preorder];
    }
  }

  // Increment start_postorder for the consecutive node in postorder to have the
  // correct id.
  ++start_postorder;

  // Return the number of nodes in the subtree rooted at this node.
  return desc_sum + 1;
  
}